

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void * __thiscall gl4cts::GLSL420Pack::Utils::buffer::map(buffer *this,GLenum access)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  void *pvVar4;
  long lVar3;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x40))(this->m_target,this->m_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"bindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x44e8);
  pvVar4 = (void *)(**(code **)(lVar3 + 0xcf8))(this->m_target,access);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x44eb);
  return pvVar4;
}

Assistant:

void* Utils::buffer::map(GLenum access) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindBuffer(m_target, m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bindBuffer");

	void* result = gl.mapBuffer(m_target, access);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	return result;
}